

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O0

bool senjo::ParamMatch(string *name,char **params)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  char *__s2;
  size_t __n;
  long lVar4;
  char **params_local;
  string *name_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) || (*params == (char *)0x0)) {
    return false;
  }
  pcVar1 = *params;
  __s2 = (char *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  iVar2 = strncmp(pcVar1,__s2,__n);
  if (iVar2 == 0) {
    pcVar1 = *params;
    lVar4 = std::__cxx11::string::size();
    if (pcVar1[lVar4] != '\0') {
      pcVar1 = *params;
      lVar4 = std::__cxx11::string::size();
      iVar2 = isspace((int)pcVar1[lVar4]);
      if (iVar2 == 0) goto LAB_00151690;
    }
    lVar4 = std::__cxx11::string::size();
    *params = *params + lVar4;
    NextWord(params);
    name_local._7_1_ = true;
  }
  else {
LAB_00151690:
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

static inline bool ParamMatch(const std::string& name, const char*& params)
{
  if (name.empty() || !params) {
    return false;
  }
  if (strncmp(params, name.c_str(), name.size()) ||
      (params[name.size()] && !isspace(params[name.size()])))
  {
    return false;
  }
  NextWord(params += name.size());
  return true;
}